

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O3

bool __thiscall
cappuccino::tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::do_insert_update
          (tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          unsigned_long *key,unsigned_long *value,time_point now,time_point expire_time,allow a)

{
  iterator keyed_position;
  
  keyed_position =
       std::
       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(this + 0x48),key);
  if (keyed_position.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
      ._M_cur == (__node_type *)0x0) {
    if ((a & insert) == 0) {
      return false;
    }
    do_insert(this,key,value,now,expire_time);
  }
  else {
    if (((a & update) == 0) &&
       (((a & insert) == 0 ||
        ((long)now.__d.__r <
         *(long *)(*(long *)(this + 0x30) +
                  *(long *)((long)keyed_position.
                                  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                  ._M_cur + 0x10) * 0x28))))) {
      return false;
    }
    do_update(this,(iterator)
                   keyed_position.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                   _M_cur,value,expire_time);
  }
  return true;
}

Assistant:

auto do_insert_update(
        const key_type&                       key,
        value_type&&                          value,
        std::chrono::steady_clock::time_point now,
        std::chrono::steady_clock::time_point expire_time,
        allow                                 a) -> bool
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            if (update_allowed(a))
            {
                do_update(keyed_position, std::move(value), expire_time);
                return true;
            }
            else if (insert_allowed(a))
            {
                // If the item has expired and this is INSERT then allow the
                // insert to proceed, this can just be an update in place.
                const auto& [k, element_idx] = *keyed_position;
                element& e                   = m_elements[element_idx];
                if (now >= e.m_expire_time)
                {
                    do_update(keyed_position, std::move(value), expire_time);
                    return true;
                }
            }
        }
        else
        {
            if (insert_allowed(a))
            {
                do_insert(key, std::move(value), now, expire_time);
                return true;
            }
        }
        return false;
    }